

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O2

bool __thiscall internalJSONNode::operator_cast_to_bool(internalJSONNode *this)

{
  double dVar1;
  uchar uVar2;
  undefined1 uVar3;
  json_string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  Fetch(this);
  uVar2 = this->_type;
  if (uVar2 == '\0') {
    uVar3 = 0;
  }
  else if (uVar2 == '\x02') {
    dVar1 = (this->_value)._number;
    uVar3 = dVar1 <= -1e-05;
    if (0.0 < dVar1) {
      uVar3 = 1e-05 <= dVar1;
    }
  }
  else {
    __lhs = jsonSingletonERROR_UNDEFINED::getValue_abi_cxx11_();
    std::operator+(&bStack_38,__lhs,"(bool)");
    JSONDebug::_JSON_ASSERT(uVar2 == '\x03',&bStack_38);
    std::__cxx11::string::~string((string *)&bStack_38);
    uVar3 = (this->_value)._bool;
  }
  return (bool)uVar3;
}

Assistant:

internalJSONNode::operator bool() const json_nothrow {
    Fetch();
    #ifdef JSON_CASTABLE /*-> JSON_CASTABLE */
	   switch(type()){
		  case JSON_NUMBER:
			 return !_floatsAreEqual(_value._number, (json_number)0.0);
		  case JSON_NULL:
			 return false;
	   }
    #endif /*<- */
    JSON_ASSERT(type() == JSON_BOOL, json_global(ERROR_UNDEFINED) + JSON_TEXT("(bool)"));
    return _value._bool;
}